

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hpp
# Opt level: O1

var cs_impl::fiber::await<cs_impl::runtime_cs_ext::async_callable>(async_callable *func)

{
  future_status fVar1;
  routine_t rVar2;
  undefined8 uVar3;
  future<cs_impl::any> future;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  _State_baseV2 *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  LOCK();
  cs::global_thread_counter = cs::global_thread_counter + 1;
  UNLOCK();
  std::async<cs_impl::runtime_cs_ext::async_callable&>((launch)&local_28,(async_callable *)0x1);
  local_30.__r = 0;
  if (local_28 == (_State_baseV2 *)0x0) {
LAB_001b7844:
    uVar3 = std::__throw_future_error(3);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    LOCK();
    cs::global_thread_counter = cs::global_thread_counter + -1;
    UNLOCK();
    _Unwind_Resume(uVar3);
  }
  fVar1 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000l>>(local_28,&local_30)
  ;
  if (fVar1 == timeout) {
    do {
      rVar2 = current();
      if (rVar2 != 0) {
        yield();
      }
      local_30.__r = 0;
      if (local_28 == (_State_baseV2 *)0x0) {
        std::__throw_future_error(3);
        goto LAB_001b7844;
      }
      fVar1 = std::__future_base::_State_baseV2::wait_for<long,std::ratio<1l,1000l>>
                        (local_28,&local_30);
    } while (fVar1 == timeout);
  }
  std::future<cs_impl::any>::get((future<cs_impl::any> *)func);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  LOCK();
  cs::global_thread_counter = cs::global_thread_counter + -1;
  UNLOCK();
  return (var)(proxy *)func;
}

Assistant:

inline cs::var await(Function &&func)
		{
			cs::thread_guard guard;
			auto future = std::async(std::launch::async, func);
			std::future_status status = future.wait_for(std::chrono::milliseconds(0));

			while (status == std::future_status::timeout) {
				if (current() != 0)
					yield();

				status = future.wait_for(std::chrono::milliseconds(0));
			}
			return future.get();
		}